

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism_base.cpp
# Opt level: O0

int __thiscall
zmq::mechanism_base_t::check_basic_command_structure(mechanism_base_t *this,msg_t *msg_)

{
  size_t sVar1;
  byte *pbVar2;
  socket_base_t *psVar3;
  int *piVar4;
  socket_base_t *in_RDI;
  endpoint_uri_pair_t *in_stack_ffffffffffffffd8;
  int err_;
  
  sVar1 = msg_t::size((msg_t *)in_stack_ffffffffffffffd8);
  if (1 < sVar1) {
    in_stack_ffffffffffffffd8 =
         (endpoint_uri_pair_t *)msg_t::size((msg_t *)in_stack_ffffffffffffffd8);
    pbVar2 = (byte *)msg_t::data((msg_t *)in_stack_ffffffffffffffd8);
    if ((endpoint_uri_pair_t *)(ulong)*pbVar2 < in_stack_ffffffffffffffd8) {
      return 0;
    }
  }
  psVar3 = session_base_t::get_socket(*(session_base_t **)((long)&(in_RDI->_sync)._mutex + 8));
  err_ = (int)((ulong)psVar3 >> 0x20);
  session_base_t::get_endpoint((session_base_t *)0x32000b);
  socket_base_t::event_handshake_failed_protocol(in_RDI,in_stack_ffffffffffffffd8,err_);
  piVar4 = __errno_location();
  *piVar4 = 0x47;
  return -1;
}

Assistant:

int zmq::mechanism_base_t::check_basic_command_structure (msg_t *msg_) const
{
    if (msg_->size () <= 1
        || msg_->size () <= (static_cast<uint8_t *> (msg_->data ()))[0]) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (),
          ZMQ_PROTOCOL_ERROR_ZMTP_MALFORMED_COMMAND_UNSPECIFIED);
        errno = EPROTO;
        return -1;
    }
    return 0;
}